

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O3

void prepare_for_output_pass(j_decompress_ptr cinfo)

{
  jpeg_decomp_master *pjVar1;
  jpeg_progress_mgr *pjVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  J_BUF_MODE JVar5;
  
  pjVar1 = cinfo->master;
  if (pjVar1->is_dummy_pass == 0) {
    if ((cinfo->quantize_colors != 0) && (cinfo->colormap == (JSAMPARRAY)0x0)) {
      if ((cinfo->two_pass_quantize == 0) || (cinfo->enable_2pass_quant == 0)) {
        if (cinfo->enable_1pass_quant == 0) {
          pjVar3 = cinfo->err;
          pjVar3->msg_code = 0x2f;
          (*pjVar3->error_exit)((j_common_ptr)cinfo);
        }
        else {
          cinfo->cquantize = (jpeg_color_quantizer *)pjVar1[1].finish_output_pass;
        }
      }
      else {
        cinfo->cquantize = *(jpeg_color_quantizer **)&pjVar1[1].is_dummy_pass;
        pjVar1->is_dummy_pass = 1;
      }
    }
    (*cinfo->idct->start_pass)(cinfo);
    (*cinfo->coef->start_output_pass)(cinfo);
    if (cinfo->raw_data_out != 0) goto LAB_00114765;
    if (*(int *)((long)&pjVar1[1].prepare_for_output_pass + 4) == 0) {
      (*cinfo->cconvert->start_pass)(cinfo);
    }
    (*cinfo->upsample->start_pass)(cinfo);
    if (cinfo->quantize_colors != 0) {
      (*cinfo->cquantize->start_pass)(cinfo,pjVar1->is_dummy_pass);
    }
    (*cinfo->post->start_pass)(cinfo,SUB14(pjVar1->is_dummy_pass != 0,0) * 3);
    JVar5 = JBUF_PASS_THRU;
  }
  else {
    pjVar1->is_dummy_pass = 0;
    (*cinfo->cquantize->start_pass)(cinfo,0);
    JVar5 = JBUF_CRANK_DEST;
    (*cinfo->post->start_pass)(cinfo,JBUF_CRANK_DEST);
  }
  (*cinfo->main->start_pass)(cinfo,JVar5);
LAB_00114765:
  pjVar2 = cinfo->progress;
  if (pjVar2 != (jpeg_progress_mgr *)0x0) {
    iVar4 = *(int *)&pjVar1[1].prepare_for_output_pass;
    pjVar2->completed_passes = iVar4;
    iVar4 = (iVar4 - (uint)(pjVar1->is_dummy_pass == 0)) + 2;
    pjVar2->total_passes = iVar4;
    if ((cinfo->buffered_image != 0) && (cinfo->inputctl->eoi_reached == 0)) {
      pjVar2->total_passes = (iVar4 - (uint)(cinfo->enable_2pass_quant == 0)) + 2;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
prepare_for_output_pass (j_decompress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr) cinfo->master;

  if (master->pub.is_dummy_pass) {
#ifdef QUANT_2PASS_SUPPORTED
    /* Final pass of 2-pass quantization */
    master->pub.is_dummy_pass = FALSE;
    (*cinfo->cquantize->start_pass) (cinfo, FALSE);
    (*cinfo->post->start_pass) (cinfo, JBUF_CRANK_DEST);
    (*cinfo->main->start_pass) (cinfo, JBUF_CRANK_DEST);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif /* QUANT_2PASS_SUPPORTED */
  } else {
    if (cinfo->quantize_colors && cinfo->colormap == NULL) {
      /* Select new quantization method */
      if (cinfo->two_pass_quantize && cinfo->enable_2pass_quant) {
	cinfo->cquantize = master->quantizer_2pass;
	master->pub.is_dummy_pass = TRUE;
      } else if (cinfo->enable_1pass_quant) {
	cinfo->cquantize = master->quantizer_1pass;
      } else {
	ERREXIT(cinfo, JERR_MODE_CHANGE);
      }
    }
    (*cinfo->idct->start_pass) (cinfo);
    (*cinfo->coef->start_output_pass) (cinfo);
    if (! cinfo->raw_data_out) {
      if (! master->using_merged_upsample)
	(*cinfo->cconvert->start_pass) (cinfo);
      (*cinfo->upsample->start_pass) (cinfo);
      if (cinfo->quantize_colors)
	(*cinfo->cquantize->start_pass) (cinfo, master->pub.is_dummy_pass);
      (*cinfo->post->start_pass) (cinfo,
	    (master->pub.is_dummy_pass ? JBUF_SAVE_AND_PASS : JBUF_PASS_THRU));
      (*cinfo->main->start_pass) (cinfo, JBUF_PASS_THRU);
    }
  }

  /* Set up progress monitor's pass info if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->completed_passes = master->pass_number;
    cinfo->progress->total_passes = master->pass_number +
				    (master->pub.is_dummy_pass ? 2 : 1);
    /* In buffered-image mode, we assume one more output pass if EOI not
     * yet reached, but no more passes if EOI has been reached.
     */
    if (cinfo->buffered_image && ! cinfo->inputctl->eoi_reached) {
      cinfo->progress->total_passes += (cinfo->enable_2pass_quant ? 2 : 1);
    }
  }
}